

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  Name *pNVar1;
  ExternalKind EVar2;
  Output *pOVar3;
  pointer puVar4;
  _Head_base<0UL,_wasm::Function_*,_false> _Var5;
  char *pcVar6;
  pointer puVar7;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var8;
  pointer puVar9;
  _Head_base<0UL,_wasm::Table_*,_false> _Var10;
  Export *pEVar11;
  ushort uVar12;
  Wasm2JSGlue *pWVar13;
  ostream *poVar14;
  size_type sVar15;
  Module *pMVar16;
  Module *pMVar17;
  iterator __end2_1;
  iterator __end2;
  pointer puVar18;
  __node_base_ptr p_Var19;
  iterator __begin2;
  pointer puVar20;
  pointer puVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  undefined1 local_f8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  Wasm2JSGlue *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_50;
  long local_48;
  long local_40 [2];
  
  pMVar17 = this->wasm;
  puVar18 = (pMVar17->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar18 !=
       (pMVar17->memories).
       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&((puVar18->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable + 0x20) != (char *)0x0)) {
    pOVar3 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"var mem",7);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(pOVar3 + 0x200),(this->moduleName).super_IString.str._M_str,
                         (this->moduleName).super_IString.str._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," = new ArrayBuffer(",0x13);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,");\n",3);
  }
  pOVar3 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"var ret",7);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(pOVar3 + 0x200),(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ",3);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"({\n",3);
  local_f8 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  pMVar16 = this->wasm;
  puVar20 = (pMVar16->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pMVar16->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  if (puVar20 != puVar4) {
    do {
      _Var5._M_head_impl =
           (puVar20->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
        pcVar6 = *(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x30);
        iVar40 = (int)pcVar6;
        iVar41 = (int)((ulong)pcVar6 >> 0x20);
        auVar62._0_4_ = -(uint)((int)_Init == iVar40);
        auVar62._4_4_ = -(uint)((int)((ulong)_Init >> 0x20) == iVar41);
        auVar62._8_4_ = -(uint)((int)__M_construct == iVar40);
        auVar62._12_4_ = -(uint)((int)((ulong)__M_construct >> 0x20) == iVar41);
        auVar69._4_4_ = auVar62._0_4_;
        auVar69._0_4_ = auVar62._4_4_;
        auVar69._8_4_ = auVar62._12_4_;
        auVar69._12_4_ = auVar62._8_4_;
        auVar56._0_4_ = -(uint)((int)cashew::MINUS == iVar40);
        auVar56._4_4_ = -(uint)((int)((ulong)cashew::MINUS >> 0x20) == iVar41);
        auVar56._8_4_ = -(uint)((int)_dump == iVar40);
        auVar56._12_4_ = -(uint)((int)((ulong)_dump >> 0x20) == iVar41);
        auVar63._4_4_ = auVar56._0_4_;
        auVar63._0_4_ = auVar56._4_4_;
        auVar63._8_4_ = auVar56._12_4_;
        auVar63._12_4_ = auVar56._8_4_;
        auVar64 = packssdw(auVar63 & auVar56,auVar69 & auVar62);
        auVar47._0_4_ = -(uint)((int)_getStruct == iVar40);
        auVar47._4_4_ = -(uint)((int)((ulong)_getStruct >> 0x20) == iVar41);
        auVar47._8_4_ = -(uint)((int)cashew::CALL == iVar40);
        auVar47._12_4_ = -(uint)((int)((ulong)cashew::CALL >> 0x20) == iVar41);
        auVar57._4_4_ = auVar47._0_4_;
        auVar57._0_4_ = auVar47._4_4_;
        auVar57._8_4_ = auVar47._12_4_;
        auVar57._12_4_ = auVar47._8_4_;
        auVar50._0_4_ = -(uint)((int)cashew::TRSHIFT == iVar40);
        auVar50._4_4_ = -(uint)((int)((ulong)cashew::TRSHIFT >> 0x20) == iVar41);
        auVar50._8_4_ = -(uint)((int)cashew::SET == iVar40);
        auVar50._12_4_ = -(uint)((int)((ulong)cashew::SET >> 0x20) == iVar41);
        auVar48._4_4_ = auVar50._0_4_;
        auVar48._0_4_ = auVar50._4_4_;
        auVar48._8_4_ = auVar50._12_4_;
        auVar48._12_4_ = auVar50._8_4_;
        auVar49 = packssdw(auVar48 & auVar50,auVar57 & auVar47);
        auVar50 = packssdw(auVar49,auVar64);
        auVar33._0_4_ = -(uint)((int)ABI::wasm2js::TABLE_FILL == iVar40);
        auVar33._4_4_ = -(uint)((int)((ulong)ABI::wasm2js::TABLE_FILL >> 0x20) == iVar41);
        auVar33._8_4_ = -(uint)((int)_finalize == iVar40);
        auVar33._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar41);
        auVar42._4_4_ = auVar33._0_4_;
        auVar42._0_4_ = auVar33._4_4_;
        auVar42._8_4_ = auVar33._12_4_;
        auVar42._12_4_ = auVar33._8_4_;
        auVar35._0_4_ = -(uint)((int)cashew::OBJECT == iVar40);
        auVar35._4_4_ = -(uint)((int)((ulong)cashew::OBJECT >> 0x20) == iVar41);
        auVar35._8_4_ = -(uint)((int)UINT16ARRAY == iVar40);
        auVar35._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar41);
        auVar34._4_4_ = auVar35._0_4_;
        auVar34._0_4_ = auVar35._4_4_;
        auVar34._8_4_ = auVar35._12_4_;
        auVar34._12_4_ = auVar35._8_4_;
        auVar35 = packssdw(auVar34 & auVar35,auVar42 & auVar33);
        auVar64._0_4_ = -(uint)((int)__Unwind_Resume == iVar40);
        auVar64._4_4_ = -(uint)((int)((ulong)__Unwind_Resume >> 0x20) == iVar41);
        auVar64._8_4_ = -(uint)((int)std::cout == iVar40);
        auVar64._12_4_ = -(uint)((int)((ulong)std::cout >> 0x20) == iVar41);
        auVar28._4_4_ = auVar64._0_4_;
        auVar28._0_4_ = auVar64._4_4_;
        auVar28._8_4_ = auVar64._12_4_;
        auVar28._12_4_ = auVar64._8_4_;
        auVar49._0_4_ = -(uint)((int)_containsPass == iVar40);
        auVar49._4_4_ = -(uint)((int)((ulong)_containsPass >> 0x20) == iVar41);
        auVar49._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar40);
        auVar49._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar41);
        auVar53._4_4_ = auVar49._0_4_;
        auVar53._0_4_ = auVar49._4_4_;
        auVar53._8_4_ = auVar49._12_4_;
        auVar53._12_4_ = auVar49._8_4_;
        auVar49 = packssdw(auVar53 & auVar49,auVar28 & auVar64);
        auVar49 = packssdw(auVar49,auVar35);
        auVar49 = packsswb(auVar49,auVar50);
        uVar12 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar49[0xf] >> 7) << 0xf;
        pMVar17 = (Module *)(ulong)uVar12;
        if ((uVar12 == 0) && (pMVar17 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar6)) {
          pNVar1 = (Name *)((long)&(_Var5._M_head_impl)->super_Importable + 0x18);
          sVar15 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_f8,pNVar1);
          if (sVar15 == 0) {
            pOVar3 = local_78->out;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"  \"",3)
            ;
            name.super_IString.str._M_str = (char *)pMVar17;
            name.super_IString.str._M_len =
                 (size_t)*(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20);
            poVar14 = wasm::operator<<((wasm *)(pOVar3 + 0x200),
                                       *(ostream **)
                                        &((Name *)((long)&(_Var5._M_head_impl)->super_Importable +
                                                  0x18))->super_IString,name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": ",3);
            pcVar6 = *(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20);
            local_70 = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,pcVar6,
                       pcVar6 + *(long *)&((Name *)((long)&(_Var5._M_head_impl)->super_Importable +
                                                   0x18))->super_IString);
            ::wasm::asmangle(&local_50,&local_70);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_50,local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\n",2);
            if (local_50 !=
                (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            local_50 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_f8;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      (local_50,pNVar1,&local_50);
          }
        }
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar4);
    pMVar16 = local_78->wasm;
  }
  puVar18 = (pMVar16->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pMVar16->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 != puVar7) {
    do {
      _Var8._M_head_impl =
           (puVar18->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
        pcVar6 = *(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x30);
        iVar40 = (int)pcVar6;
        iVar41 = (int)((ulong)pcVar6 >> 0x20);
        auVar65._0_4_ = -(uint)((int)_Init == iVar40);
        auVar65._4_4_ = -(uint)((int)((ulong)_Init >> 0x20) == iVar41);
        auVar65._8_4_ = -(uint)((int)__M_construct == iVar40);
        auVar65._12_4_ = -(uint)((int)((ulong)__M_construct >> 0x20) == iVar41);
        auVar70._4_4_ = auVar65._0_4_;
        auVar70._0_4_ = auVar65._4_4_;
        auVar70._8_4_ = auVar65._12_4_;
        auVar70._12_4_ = auVar65._8_4_;
        auVar58._0_4_ = -(uint)((int)cashew::MINUS == iVar40);
        auVar58._4_4_ = -(uint)((int)((ulong)cashew::MINUS >> 0x20) == iVar41);
        auVar58._8_4_ = -(uint)((int)_dump == iVar40);
        auVar58._12_4_ = -(uint)((int)((ulong)_dump >> 0x20) == iVar41);
        auVar66._4_4_ = auVar58._0_4_;
        auVar66._0_4_ = auVar58._4_4_;
        auVar66._8_4_ = auVar58._12_4_;
        auVar66._12_4_ = auVar58._8_4_;
        auVar64 = packssdw(auVar66 & auVar58,auVar70 & auVar65);
        auVar51._0_4_ = -(uint)((int)_getStruct == iVar40);
        auVar51._4_4_ = -(uint)((int)((ulong)_getStruct >> 0x20) == iVar41);
        auVar51._8_4_ = -(uint)((int)cashew::CALL == iVar40);
        auVar51._12_4_ = -(uint)((int)((ulong)cashew::CALL >> 0x20) == iVar41);
        auVar59._4_4_ = auVar51._0_4_;
        auVar59._0_4_ = auVar51._4_4_;
        auVar59._8_4_ = auVar51._12_4_;
        auVar59._12_4_ = auVar51._8_4_;
        auVar43._0_4_ = -(uint)((int)cashew::TRSHIFT == iVar40);
        auVar43._4_4_ = -(uint)((int)((ulong)cashew::TRSHIFT >> 0x20) == iVar41);
        auVar43._8_4_ = -(uint)((int)cashew::SET == iVar40);
        auVar43._12_4_ = -(uint)((int)((ulong)cashew::SET >> 0x20) == iVar41);
        auVar52._4_4_ = auVar43._0_4_;
        auVar52._0_4_ = auVar43._4_4_;
        auVar52._8_4_ = auVar43._12_4_;
        auVar52._12_4_ = auVar43._8_4_;
        auVar49 = packssdw(auVar52 & auVar43,auVar59 & auVar51);
        auVar53 = packssdw(auVar49,auVar64);
        auVar36._0_4_ = -(uint)((int)ABI::wasm2js::TABLE_FILL == iVar40);
        auVar36._4_4_ = -(uint)((int)((ulong)ABI::wasm2js::TABLE_FILL >> 0x20) == iVar41);
        auVar36._8_4_ = -(uint)((int)_finalize == iVar40);
        auVar36._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar41);
        auVar44._4_4_ = auVar36._0_4_;
        auVar44._0_4_ = auVar36._4_4_;
        auVar44._8_4_ = auVar36._12_4_;
        auVar44._12_4_ = auVar36._8_4_;
        auVar29._0_4_ = -(uint)((int)cashew::OBJECT == iVar40);
        auVar29._4_4_ = -(uint)((int)((ulong)cashew::OBJECT >> 0x20) == iVar41);
        auVar29._8_4_ = -(uint)((int)UINT16ARRAY == iVar40);
        auVar29._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar41);
        auVar37._4_4_ = auVar29._0_4_;
        auVar37._0_4_ = auVar29._4_4_;
        auVar37._8_4_ = auVar29._12_4_;
        auVar37._12_4_ = auVar29._8_4_;
        auVar64 = packssdw(auVar37 & auVar29,auVar44 & auVar36);
        auVar24._0_4_ = -(uint)((int)__Unwind_Resume == iVar40);
        auVar24._4_4_ = -(uint)((int)((ulong)__Unwind_Resume >> 0x20) == iVar41);
        auVar24._8_4_ = -(uint)((int)std::cout == iVar40);
        auVar24._12_4_ = -(uint)((int)((ulong)std::cout >> 0x20) == iVar41);
        auVar30._4_4_ = auVar24._0_4_;
        auVar30._0_4_ = auVar24._4_4_;
        auVar30._8_4_ = auVar24._12_4_;
        auVar30._12_4_ = auVar24._8_4_;
        auVar22._0_4_ = -(uint)((int)_containsPass == iVar40);
        auVar22._4_4_ = -(uint)((int)((ulong)_containsPass >> 0x20) == iVar41);
        auVar22._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar40);
        auVar22._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar41);
        auVar25._4_4_ = auVar22._0_4_;
        auVar25._0_4_ = auVar22._4_4_;
        auVar25._8_4_ = auVar22._12_4_;
        auVar25._12_4_ = auVar22._8_4_;
        auVar49 = packssdw(auVar25 & auVar22,auVar30 & auVar24);
        auVar49 = packssdw(auVar49,auVar64);
        auVar49 = packsswb(auVar49,auVar53);
        uVar12 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar49[0xf] >> 7) << 0xf;
        pMVar17 = (Module *)(ulong)uVar12;
        if ((uVar12 == 0) && (pMVar17 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar6)) {
          pOVar3 = local_78->out;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"  \"",3);
          name_00.super_IString.str._M_str = (char *)pMVar17;
          name_00.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x20);
          poVar14 = wasm::operator<<((wasm *)(pOVar3 + 0x200),
                                     *(ostream **)
                                      &((Name *)((long)&(_Var8._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": {\n",5);
          pOVar3 = local_78->out;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"    ",4);
          pcVar6 = *(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x30);
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar6,
                     pcVar6 + *(long *)&((Name *)((long)&(_Var8._M_head_impl)->super_Importable +
                                                 0x28))->super_IString);
          ::wasm::asmangle(&local_50,&local_70);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(pOVar3 + 0x200),(char *)local_50,local_48);
          pWVar13 = local_78;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": { buffer : mem",0x10);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(pWVar13->moduleName).super_IString.str._M_str,
                               (pWVar13->moduleName).super_IString.str._M_len);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," }\n",3);
          if (local_50 !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(pWVar13->out + 0x200),"  },\n",5);
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar7);
    pMVar16 = local_78->wasm;
  }
  puVar9 = (pMVar16->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (pMVar16->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar13 = local_78, puVar21 != puVar9;
      puVar21 = puVar21 + 1) {
    _Var10._M_head_impl =
         (puVar21->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar6 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x30);
      iVar40 = (int)pcVar6;
      iVar41 = (int)((ulong)pcVar6 >> 0x20);
      auVar67._0_4_ = -(uint)((int)_Init == iVar40);
      auVar67._4_4_ = -(uint)((int)((ulong)_Init >> 0x20) == iVar41);
      auVar67._8_4_ = -(uint)((int)__M_construct == iVar40);
      auVar67._12_4_ = -(uint)((int)((ulong)__M_construct >> 0x20) == iVar41);
      auVar71._4_4_ = auVar67._0_4_;
      auVar71._0_4_ = auVar67._4_4_;
      auVar71._8_4_ = auVar67._12_4_;
      auVar71._12_4_ = auVar67._8_4_;
      auVar60._0_4_ = -(uint)((int)cashew::MINUS == iVar40);
      auVar60._4_4_ = -(uint)((int)((ulong)cashew::MINUS >> 0x20) == iVar41);
      auVar60._8_4_ = -(uint)((int)_dump == iVar40);
      auVar60._12_4_ = -(uint)((int)((ulong)_dump >> 0x20) == iVar41);
      auVar68._4_4_ = auVar60._0_4_;
      auVar68._0_4_ = auVar60._4_4_;
      auVar68._8_4_ = auVar60._12_4_;
      auVar68._12_4_ = auVar60._8_4_;
      auVar64 = packssdw(auVar68 & auVar60,auVar71 & auVar67);
      auVar54._0_4_ = -(uint)((int)_getStruct == iVar40);
      auVar54._4_4_ = -(uint)((int)((ulong)_getStruct >> 0x20) == iVar41);
      auVar54._8_4_ = -(uint)((int)cashew::CALL == iVar40);
      auVar54._12_4_ = -(uint)((int)((ulong)cashew::CALL >> 0x20) == iVar41);
      auVar61._4_4_ = auVar54._0_4_;
      auVar61._0_4_ = auVar54._4_4_;
      auVar61._8_4_ = auVar54._12_4_;
      auVar61._12_4_ = auVar54._8_4_;
      auVar45._0_4_ = -(uint)((int)cashew::TRSHIFT == iVar40);
      auVar45._4_4_ = -(uint)((int)((ulong)cashew::TRSHIFT >> 0x20) == iVar41);
      auVar45._8_4_ = -(uint)((int)cashew::SET == iVar40);
      auVar45._12_4_ = -(uint)((int)((ulong)cashew::SET >> 0x20) == iVar41);
      auVar55._4_4_ = auVar45._0_4_;
      auVar55._0_4_ = auVar45._4_4_;
      auVar55._8_4_ = auVar45._12_4_;
      auVar55._12_4_ = auVar45._8_4_;
      auVar49 = packssdw(auVar55 & auVar45,auVar61 & auVar54);
      auVar53 = packssdw(auVar49,auVar64);
      auVar38._0_4_ = -(uint)((int)ABI::wasm2js::TABLE_FILL == iVar40);
      auVar38._4_4_ = -(uint)((int)((ulong)ABI::wasm2js::TABLE_FILL >> 0x20) == iVar41);
      auVar38._8_4_ = -(uint)((int)_finalize == iVar40);
      auVar38._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar41);
      auVar46._4_4_ = auVar38._0_4_;
      auVar46._0_4_ = auVar38._4_4_;
      auVar46._8_4_ = auVar38._12_4_;
      auVar46._12_4_ = auVar38._8_4_;
      auVar31._0_4_ = -(uint)((int)cashew::OBJECT == iVar40);
      auVar31._4_4_ = -(uint)((int)((ulong)cashew::OBJECT >> 0x20) == iVar41);
      auVar31._8_4_ = -(uint)((int)UINT16ARRAY == iVar40);
      auVar31._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar41);
      auVar39._4_4_ = auVar31._0_4_;
      auVar39._0_4_ = auVar31._4_4_;
      auVar39._8_4_ = auVar31._12_4_;
      auVar39._12_4_ = auVar31._8_4_;
      auVar64 = packssdw(auVar39 & auVar31,auVar46 & auVar38);
      auVar26._0_4_ = -(uint)((int)__Unwind_Resume == iVar40);
      auVar26._4_4_ = -(uint)((int)((ulong)__Unwind_Resume >> 0x20) == iVar41);
      auVar26._8_4_ = -(uint)((int)std::cout == iVar40);
      auVar26._12_4_ = -(uint)((int)((ulong)std::cout >> 0x20) == iVar41);
      auVar32._4_4_ = auVar26._0_4_;
      auVar32._0_4_ = auVar26._4_4_;
      auVar32._8_4_ = auVar26._12_4_;
      auVar32._12_4_ = auVar26._8_4_;
      auVar23._0_4_ = -(uint)((int)_containsPass == iVar40);
      auVar23._4_4_ = -(uint)((int)((ulong)_containsPass >> 0x20) == iVar41);
      auVar23._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar40);
      auVar23._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar41);
      auVar27._4_4_ = auVar23._0_4_;
      auVar27._0_4_ = auVar23._4_4_;
      auVar27._8_4_ = auVar23._12_4_;
      auVar27._12_4_ = auVar23._8_4_;
      auVar49 = packssdw(auVar27 & auVar23,auVar32 & auVar26);
      auVar49 = packssdw(auVar49,auVar64);
      auVar49 = packsswb(auVar49,auVar53);
      uVar12 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar49[0xf] >> 7) << 0xf;
      pMVar17 = (Module *)(ulong)uVar12;
      if ((uVar12 == 0) && (pMVar17 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar6)) {
        pNVar1 = (Name *)((long)&(_Var10._M_head_impl)->super_Importable + 0x18);
        sVar15 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar15 == 0) {
          pOVar3 = local_78->out;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar3 + 0x200),"  \"",3);
          name_01.super_IString.str._M_str = (char *)pMVar17;
          name_01.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20);
          poVar14 = wasm::operator<<((wasm *)(pOVar3 + 0x200),
                                     *(ostream **)
                                      &((Name *)((long)&(_Var10._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_01);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": ",3);
          pcVar6 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20);
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,pcVar6,
                     pcVar6 + *(long *)&((Name *)((long)&(_Var10._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          ::wasm::asmangle(&local_50,&local_70);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\n",2);
          if (local_50 !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          local_50 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    (local_50,pNVar1,&local_50);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_78->out + 0x200),"});\n",4);
  if ((pWVar13->flags).allowAsserts == false) {
    p_Var19 = (__node_base_ptr)
              (pWVar13->wasm->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    seenModules._M_h._M_single_bucket =
         (__node_base_ptr)
         (pWVar13->wasm->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var19 != seenModules._M_h._M_single_bucket) {
      do {
        EVar2 = ((((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
                  &p_Var19->_M_nxt)->
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind;
        if (((uint)EVar2 < 4) && (EVar2 != Table)) {
          pOVar3 = pWVar13->out;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(pOVar3 + 0x200),"export var ",0xb);
          pEVar11 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                       *)&p_Var19->_M_nxt)->
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar6 = *(char **)((long)&(pEVar11->name).super_IString + 8);
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar6,pcVar6 + *(long *)&(pEVar11->name).super_IString);
          ::wasm::asmangle(&local_50,(string *)local_b8);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(pOVar3 + 0x200),(char *)local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ret",6);
          name_02.super_IString.str._M_str = (char *)pMVar17;
          name_02.super_IString.str._M_len = (size_t)(pWVar13->moduleName).super_IString.str._M_str;
          poVar14 = wasm::operator<<((wasm *)poVar14,
                                     (ostream *)(pWVar13->moduleName).super_IString.str._M_len,
                                     name_02);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
          pEVar11 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                       *)&p_Var19->_M_nxt)->
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar6 = *(char **)((long)&(pEVar11->name).super_IString + 8);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,pcVar6,pcVar6 + *(long *)&(pEVar11->name).super_IString);
          ::wasm::asmangle(&local_70,(string *)local_98);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)local_70,local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          if (local_50 !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0],local_a8[0] + 1);
          }
        }
        p_Var19 = p_Var19 + 1;
      } while (p_Var19 != seenModules._M_h._M_single_bucket);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f8);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}